

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

void __thiscall
pugi::impl::anon_unknown_0::xpath_node_set_raw::remove_duplicates
          (xpath_node_set_raw *this,xpath_allocator *alloc)

{
  xml_node_struct *pxVar1;
  xml_attribute_struct *pxVar2;
  ulong uVar3;
  void *__s;
  xpath_node *pxVar4;
  xpath_node *pxVar5;
  ulong uVar6;
  xpath_node *pxVar7;
  xpath_node *pxVar8;
  xml_node_struct *pxVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  xpath_allocator_capture cr;
  
  if (this->_type == type_unsorted) {
    pxVar5 = this->_end;
    pxVar4 = this->_begin;
    uVar6 = (long)pxVar5 - (long)pxVar4;
    if (0x20 < (long)uVar6) {
      cr._state._root = alloc->_root;
      cr._state._root_size = alloc->_root_size;
      cr._state._error = alloc->_error;
      uVar3 = 1;
      do {
        uVar12 = uVar3;
        uVar3 = uVar12 * 2;
      } while (uVar12 < (uVar6 >> 5) + (uVar6 >> 4));
      cr._target = alloc;
      __s = xpath_allocator::allocate(alloc,uVar12 * 8);
      if (__s != (void *)0x0) {
        memset(__s,0,uVar12 * 8);
        uVar12 = uVar12 - 1;
        pxVar4 = this->_begin;
        for (pxVar5 = pxVar4; pxVar5 != this->_end; pxVar5 = pxVar5 + 1) {
          pxVar9 = (xml_node_struct *)(pxVar5->_attribute)._attr;
          if (pxVar9 == (xml_node_struct *)0x0) {
            pxVar9 = (pxVar5->_node)._root;
          }
          if (pxVar9 != (xml_node_struct *)0x0) {
            uVar11 = ((uint)((ulong)pxVar9 >> 0x10) & 0xffff ^ (uint)pxVar9) * -0x7a143595;
            uVar11 = (uVar11 >> 0xd ^ uVar11) * -0x3d4d51cb;
            uVar6 = (ulong)((uVar11 >> 0x10 ^ uVar11) & (uint)uVar12);
            lVar10 = 1;
            while( true ) {
              if (uVar12 < lVar10 - 1U) {
                __assert_fail("false && \"Hash table is full\"",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                              ,0x1d88,
                              "bool pugi::impl::(anonymous namespace)::hash_insert(const void **, size_t, const void *)"
                             );
              }
              pxVar1 = *(xml_node_struct **)((long)__s + uVar6 * 8);
              if (pxVar1 == (xml_node_struct *)0x0) break;
              if (pxVar1 == pxVar9) goto LAB_00112d81;
              uVar6 = uVar6 + lVar10;
              lVar10 = lVar10 + 1;
              uVar6 = uVar6 & uVar12;
            }
            *(xml_node_struct **)((long)__s + uVar6 * 8) = pxVar9;
            pxVar2 = (pxVar5->_attribute)._attr;
            (pxVar4->_node)._root = (pxVar5->_node)._root;
            (pxVar4->_attribute)._attr = pxVar2;
            pxVar4 = pxVar4 + 1;
          }
LAB_00112d81:
        }
        this->_end = pxVar4;
      }
      xpath_allocator_capture::~xpath_allocator_capture(&cr);
      return;
    }
  }
  else {
    pxVar4 = this->_begin;
    pxVar5 = this->_end;
  }
  lVar10 = (long)pxVar5 - (long)pxVar4;
  do {
    pxVar8 = pxVar4;
    if (lVar10 < 0x11) break;
    lVar10 = lVar10 + -0x10;
    uVar6 = vpcmpq_avx512vl((undefined1  [16])pxVar8[1],(undefined1  [16])*pxVar8,4);
    pxVar4 = pxVar8 + 1;
  } while ((uVar6 & 3) != 0);
  pxVar4 = pxVar8;
  if (pxVar8 != pxVar5) {
    while (pxVar7 = pxVar4, pxVar4 = pxVar7 + 1, pxVar4 != pxVar5) {
      uVar6 = vpcmpq_avx512vl((undefined1  [16])*pxVar8,(undefined1  [16])*pxVar4,4);
      if ((uVar6 & 3) != 0) {
        pxVar2 = pxVar7[1]._attribute._attr;
        pxVar8[1]._node._root = (pxVar4->_node)._root;
        pxVar8[1]._attribute._attr = pxVar2;
        pxVar8 = pxVar8 + 1;
      }
    }
    pxVar8 = pxVar8 + 1;
  }
  this->_end = pxVar8;
  return;
}

Assistant:

void remove_duplicates(xpath_allocator* alloc)
		{
			if (_type == xpath_node_set::type_unsorted && _end - _begin > 2)
			{
				xpath_allocator_capture cr(alloc);

				size_t size_ = static_cast<size_t>(_end - _begin);

				size_t hash_size = 1;
				while (hash_size < size_ + size_ / 2) hash_size *= 2;

				const void** hash_data = static_cast<const void**>(alloc->allocate(hash_size * sizeof(void**)));
				if (!hash_data) return;

				memset(hash_data, 0, hash_size * sizeof(const void**));

				xpath_node* write = _begin;

				for (xpath_node* it = _begin; it != _end; ++it)
				{
					const void* attr = it->attribute().internal_object();
					const void* node = it->node().internal_object();
					const void* key = attr ? attr : node;

					if (key && hash_insert(hash_data, hash_size, key))
					{
						*write++ = *it;
					}
				}

				_end = write;
			}
			else
			{
				_end = unique(_begin, _end);
			}
		}